

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

void __thiscall siamese::RecoveryMatrixState::Reset(RecoveryMatrixState *this)

{
  (this->Columns).Size = 0;
  (this->Rows).Size = 0;
  (this->Pivots).Size = 0;
  (this->Matrix).Rows = 0;
  (this->Matrix).Columns = 0;
  this->PreviousNextCheckStart = 0;
  this->GEResumePivot = 0;
  return;
}

Assistant:

void RecoveryMatrixState::Reset()
{
    Columns.Clear();
    Rows.Clear();
    Pivots.Clear();

    Matrix.Clear();

    PreviousNextCheckStart = 0;
    GEResumePivot = 0;
}